

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Image.c
# Opt level: O2

DdNode * Llb_ImgComputeImage(Aig_Man_t *pAig,Vec_Ptr_t *vDdMans,DdManager *dd,DdNode *bInit,
                            Vec_Ptr_t *vQuant0,Vec_Ptr_t *vQuant1,Vec_Int_t *vDriRefs,
                            abctime TimeTarget,int fBackward,int fReorder,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  abctime aVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdManager *ddSource;
  abctime aVar6;
  Vec_Int_t *pVVar7;
  DdNode *pDVar8;
  DdNode *n;
  abctime aVar9;
  abctime time;
  abctime time_00;
  int i;
  ulong uVar10;
  
  aVar3 = Abc_Clock();
  Cudd_Ref(bInit);
  if (fBackward == 0) {
    pVVar7 = (Vec_Int_t *)Vec_PtrEntry(vQuant0,0);
    pDVar4 = Llb_ImgComputeCube(pAig,pVVar7,dd);
    Cudd_Ref(pDVar4);
    pDVar5 = Cudd_bddExistAbstract(dd,bInit,pDVar4);
    if (pDVar5 == (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,bInit);
      goto LAB_006a4ae9;
    }
  }
  else {
    pDVar4 = Llb_DriverPhaseCube(pAig,vDriRefs,dd);
    Cudd_Ref(pDVar4);
    pDVar5 = Extra_bddChangePolarity(dd,bInit,pDVar4);
  }
  Cudd_Ref(pDVar5);
  Cudd_RecursiveDeref(dd,bInit);
  Cudd_RecursiveDeref(dd,pDVar4);
  uVar10 = 0;
  while( true ) {
    i = (int)uVar10;
    if (vDdMans->nSize <= i) {
      if (fBackward == 0) {
        pDVar4 = Llb_DriverPhaseCube(pAig,vDriRefs,dd);
        Cudd_Ref(pDVar4);
        pDVar8 = Extra_bddChangePolarity(dd,pDVar5,pDVar4);
      }
      else {
        pVVar7 = (Vec_Int_t *)Vec_PtrEntry(vQuant0,0);
        pDVar4 = Llb_ImgComputeCube(pAig,pVVar7,dd);
        Cudd_Ref(pDVar4);
        pDVar8 = Cudd_bddExistAbstract(dd,pDVar5,pDVar4);
      }
      Cudd_Ref(pDVar8);
      Cudd_RecursiveDeref(dd,pDVar5);
      Cudd_RecursiveDeref(dd,pDVar4);
      if (fReorder != 0) {
        if (fVerbose == 0) {
          Cudd_ReduceHeap(dd,CUDD_REORDER_SYMM_SIFT,100);
        }
        else {
          pDVar5 = pDVar8;
          uVar1 = Cudd_DagSize(pDVar8);
          Abc_Print((int)pDVar5,"        Reordering... Before =%5d. ",(ulong)uVar1);
          Cudd_ReduceHeap(dd,CUDD_REORDER_SYMM_SIFT,100);
          pDVar5 = pDVar8;
          uVar1 = Cudd_DagSize(pDVar8);
          Abc_Print((int)pDVar5,"After =%5d. ",(ulong)uVar1);
          aVar6 = Abc_Clock();
          Abc_PrintTime(0x7bf12c,(char *)(aVar6 - aVar3),time_00);
        }
      }
      Cudd_Deref(pDVar8);
      return pDVar8;
    }
    ddSource = (DdManager *)Vec_PtrEntry(vDdMans,i);
    aVar6 = Abc_Clock();
    if (fVerbose != 0) {
      printf("   %2d : ",uVar10);
    }
    pDVar4 = Cudd_bddTransfer(ddSource,dd,ddSource->bFunc);
    if (pDVar4 == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
    Cudd_Ref(pDVar4);
    if (fVerbose != 0) {
      uVar1 = Cudd_DagSize(ddSource->bFunc);
      uVar2 = Cudd_DagSize(pDVar4);
      printf("Pt0 =%6d. Pt1 =%6d. ",(ulong)uVar1,(ulong)uVar2);
    }
    uVar10 = (ulong)(i + 1U);
    pVVar7 = (Vec_Int_t *)Vec_PtrEntry(vQuant1,i + 1U);
    pDVar8 = Llb_ImgComputeCube(pAig,pVVar7,dd);
    Cudd_Ref(pDVar8);
    n = Cudd_bddAndAbstract(dd,pDVar5,pDVar4,pDVar8);
    if (n == (DdNode *)0x0) break;
    Cudd_Ref(n);
    if (fVerbose == 0) {
      Cudd_RecursiveDeref(dd,pDVar5);
      Cudd_RecursiveDeref(dd,pDVar8);
      Cudd_RecursiveDeref(dd,pDVar4);
      pDVar5 = n;
    }
    else {
      uVar1 = Cudd_DagSize(pDVar5);
      uVar2 = Cudd_DagSize(n);
      printf("Im0 =%6d. Im1 =%6d. ",(ulong)uVar1,(ulong)uVar2);
      Cudd_RecursiveDeref(dd,pDVar5);
      Cudd_RecursiveDeref(dd,pDVar8);
      Cudd_RecursiveDeref(dd,pDVar4);
      uVar1 = Cudd_SupportSize(dd,n);
      printf("Supp =%3d. ",(ulong)uVar1);
      aVar9 = Abc_Clock();
      Abc_PrintTime(0x783014,(char *)(aVar9 - aVar6),time);
      pDVar5 = n;
    }
  }
  Cudd_RecursiveDeref(dd,pDVar5);
  Cudd_RecursiveDeref(dd,pDVar8);
LAB_006a4ae9:
  Cudd_RecursiveDeref(dd,pDVar4);
  return (DdNode *)0x0;
}

Assistant:

DdNode * Llb_ImgComputeImage( Aig_Man_t * pAig, Vec_Ptr_t * vDdMans, DdManager * dd, DdNode * bInit, 
    Vec_Ptr_t * vQuant0, Vec_Ptr_t * vQuant1, Vec_Int_t * vDriRefs, 
    abctime TimeTarget, int fBackward, int fReorder, int fVerbose )
{
//    int fCheckSupport = 0;
    DdManager * ddPart;
    DdNode * bImage, * bGroup, * bCube, * bTemp;
    int i;
    abctime clk, clk0 = Abc_Clock();

    bImage = bInit;  Cudd_Ref( bImage );
    if ( fBackward )
    {
        // change polarity
        bCube  = Llb_DriverPhaseCube( pAig, vDriRefs, dd );                Cudd_Ref( bCube );
        bImage = Extra_bddChangePolarity( dd, bTemp = bImage, bCube );     Cudd_Ref( bImage );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bCube );
    }
    else
    {
        // quantify unique vriables
        bCube  = Llb_ImgComputeCube( pAig, (Vec_Int_t *)Vec_PtrEntry(vQuant0, 0), dd ); Cudd_Ref( bCube );
        bImage = Cudd_bddExistAbstract( dd, bTemp = bImage, bCube );                    
        if ( bImage == NULL )
        {
            Cudd_RecursiveDeref( dd, bTemp );
            Cudd_RecursiveDeref( dd, bCube );
            return NULL;
        }
        Cudd_Ref( bImage );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bCube );
    }
    // perform image computation
    Vec_PtrForEachEntry( DdManager *, vDdMans, ddPart, i )
    {
        clk = Abc_Clock();
if ( fVerbose )
printf( "   %2d : ", i );
        // transfer the BDD from the group manager to the main manager
        bGroup = Cudd_bddTransfer( ddPart, dd, ddPart->bFunc );                           
        if ( bGroup == NULL )
            return NULL;
        Cudd_Ref( bGroup );
if ( fVerbose )
printf( "Pt0 =%6d. Pt1 =%6d. ", Cudd_DagSize(ddPart->bFunc), Cudd_DagSize(bGroup) );
        // perform partial product
        bCube  = Llb_ImgComputeCube( pAig, (Vec_Int_t *)Vec_PtrEntry(vQuant1, i+1), dd ); Cudd_Ref( bCube );
//        bImage = Cudd_bddAndAbstract( dd, bTemp = bImage, bGroup, bCube );                
//        bImage = Extra_bddAndAbstractTime( dd, bTemp = bImage, bGroup, bCube, TimeTarget );  
        bImage = Cudd_bddAndAbstract( dd, bTemp = bImage, bGroup, bCube );  
        if ( bImage == NULL )
        {
            Cudd_RecursiveDeref( dd, bTemp );
            Cudd_RecursiveDeref( dd, bCube );
            Cudd_RecursiveDeref( dd, bGroup );
            return NULL;
        }
        Cudd_Ref( bImage );

if ( fVerbose )
printf( "Im0 =%6d. Im1 =%6d. ", Cudd_DagSize(bTemp), Cudd_DagSize(bImage) );
//printf("\n"); Extra_bddPrintSupport(dd, bImage); printf("\n");
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bCube );
        Cudd_RecursiveDeref( dd, bGroup );

//        Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 100 );
//        Abc_Print( 1, "Reo =%6d.  ", Cudd_DagSize(bImage) );

if ( fVerbose )
printf( "Supp =%3d. ", Cudd_SupportSize(dd, bImage) );
if ( fVerbose )
Abc_PrintTime( 1, "T", Abc_Clock() - clk );
    }

    if ( !fBackward )
    {
        // change polarity
        bCube  = Llb_DriverPhaseCube( pAig, vDriRefs, dd );                Cudd_Ref( bCube );
        bImage = Extra_bddChangePolarity( dd, bTemp = bImage, bCube );     Cudd_Ref( bImage );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bCube );
    }
    else
    {
        // quantify unique vriables
        bCube  = Llb_ImgComputeCube( pAig, (Vec_Int_t *)Vec_PtrEntry(vQuant0, 0), dd ); Cudd_Ref( bCube );
        bImage = Cudd_bddExistAbstract( dd, bTemp = bImage, bCube );                    Cudd_Ref( bImage );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bCube );
    }

    if ( fReorder )
    {
    if ( fVerbose )
    Abc_Print( 1, "        Reordering... Before =%5d. ", Cudd_DagSize(bImage) );
    Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 100 );
    if ( fVerbose )
    Abc_Print( 1, "After =%5d. ", Cudd_DagSize(bImage) );
//    Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 100 );
//    Abc_Print( 1, "After =%5d.  ", Cudd_DagSize(bImage) );
    if ( fVerbose )
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk0 );
//    Abc_Print( 1, "\n" );
    }

    Cudd_Deref( bImage );
    return bImage;
}